

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  Context *context;
  java *this_00;
  long lVar2;
  long lVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var4;
  LogMessage *other;
  long *plVar5;
  OneofGeneratorInfo *pOVar6;
  ClassNameResolver *this_01;
  _Base_ptr p_Var7;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *pDVar8;
  long lVar9;
  long lVar10;
  int *local_90 [2];
  int local_80 [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  
  pDVar8 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_90[0] = &((LogMessage *)local_90)->line_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"OrBuilder","");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar8,true,(string *)local_90);
  pDVar8 = extraout_RDX;
  if (local_90[0] != &((LogMessage *)local_90)->line_) {
    operator_delete(local_90[0]);
    pDVar8 = extraout_RDX_00;
  }
  this_00 = (java *)(this->super_MessageGenerator).descriptor_;
  local_58._M_dataplus._M_p = "@java.lang.Deprecated ";
  if (*(int *)(this_00 + 0x78) < 1) {
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_58._M_dataplus._M_p = "";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_((string *)local_90,this_00,pDVar8);
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1]>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
               ,(char (*) [12])0x41949f,(char **)&local_58,(char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [10])0x3e9312,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x434b2c,
               (char (*) [1])0x3d75d9,(char (*) [2])0x420442,(char (*) [1])0x3d75d9);
    if (local_90[0] == &((LogMessage *)local_90)->line_) goto LAB_002c6ca8;
  }
  else {
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_58._M_dataplus._M_p = "";
    }
    local_38 = local_58._M_dataplus._M_p;
    ExtraMessageOrBuilderInterfaces_abi_cxx11_((string *)local_90,this_00,pDVar8);
    local_58.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_58._M_string_length = 2;
    local_58.field_2._M_local_buf[2] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1],char[4],std::__cxx11::string>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage$ver$.\n        ExtendableMessageOrBuilder<$classname$> {\n"
               ,(char (*) [12])0x41949f,&local_38,(char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [10])0x3e9312,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x434b2c,
               (char (*) [1])0x3d75d9,(char (*) [2])0x420442,(char (*) [1])0x3d75d9,
               (char (*) [4])0x3d9f76,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_90[0] == &((LogMessage *)local_90)->line_) goto LAB_002c6ca8;
  }
  operator_delete(local_90[0]);
LAB_002c6ca8:
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"{","}",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 4)) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar2 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar2 + 0x20 + lVar9) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_90,
                           "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_58,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_90);
      }
      if ((*(byte *)(lVar2 + 1 + lVar9) & 8) == 0) {
        plVar5 = (long *)(*(long *)(lVar2 + 0x20 + lVar9) + 0x28);
      }
      else {
        lVar3 = *(long *)(lVar2 + 0x28 + lVar9);
        if (lVar3 == 0) {
          plVar5 = (long *)(*(long *)(lVar2 + 0x10 + lVar9) + 0x70);
        }
        else {
          plVar5 = (long *)(lVar3 + 0x50);
        }
      }
      _Var4._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar2 - *plVar5) + lVar9) >> 3) * 0x38e38e39]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x48;
    } while (lVar10 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
  }
  p_Var7 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      pOVar6 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var7 + 1));
      this_01 = Context::GetNameResolver(this->context_);
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)local_90,this_01,(this->super_MessageGenerator).descriptor_,true);
      io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
                (printer,
                 "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                 ,(char (*) [23])"oneof_capitalized_name",&pOVar6->capitalized_name,
                 (char (*) [10])0x3e9312,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      if (local_90[0] != &((LogMessage *)local_90)->line_) {
        operator_delete(local_90[0]);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage$ver$.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "", "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (auto oneof : oneofs_) {
    printer->Print(
        "\n"
        "public $classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}